

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

void __thiscall Mat::Mat(Mat *this,Mat *rhs)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  
  iVar1 = rhs->n_rows_;
  this->n_rows_ = iVar1;
  iVar2 = rhs->n_cols_;
  this->n_cols_ = iVar2;
  if (iVar1 < 1) {
    pdVar4 = (double *)0x0;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2 * iVar1) {
      uVar5 = (long)(iVar2 * iVar1) * 8;
    }
    pdVar4 = (double *)operator_new__(uVar5);
  }
  this->v_ = pdVar4;
  if (0 < iVar2 * iVar1) {
    pdVar3 = rhs->v_;
    uVar5 = 0;
    do {
      pdVar4[uVar5] = pdVar3[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)(iVar2 * iVar1) != uVar5);
  }
  return;
}

Assistant:

Mat::Mat(const Mat &rhs) : n_rows_(rhs.n_rows_),n_cols_(rhs.n_cols_), v_(n_rows_>0 ? new double[n_rows_*n_cols_] : NULL)
{
	for (int i=0; i<n_rows_*n_cols_; i++)
		v_[i] = rhs.v_[i];
}